

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DictionaryMLT<false,_false>::new_suffix_id_(DictionaryMLT<false,_false> *this)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  __p;
  tuple<ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  in_RAX;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  local_28;
  
  uVar6 = this->suffix_head_;
  if ((ulong)uVar6 == 0xffffffff) {
    puVar1 = (this->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    make_unique<ddd::DaTrie<false,false,false>>();
    std::
    vector<std::unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>>>
    ::
    emplace_back<std::unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>>
              ((vector<std::unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>,std::allocator<std::unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>>>
                *)&this->suffix_subtries_,
               (unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                *)&local_28);
    uVar6 = (uint)((ulong)((long)puVar2 - (long)puVar1) >> 3);
    std::
    unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                   *)&local_28);
  }
  else {
    local_28._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
         (tuple<ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
          )(tuple<ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            )in_RAX.
             super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
             .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
    make_unique<ddd::DaTrie<false,false,false>>();
    __p._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
         local_28._M_t.
         super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
         .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
         (tuple<ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
          )(_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
             *)((this->suffix_subtries_).
                super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar6),
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl)
    ;
    std::
    unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                   *)&local_28);
    uVar4 = this->suffix_head_;
    puVar1 = (this->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)uVar4;
    do {
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
      if ((ulong)((long)(this->suffix_subtries_).
                        super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar5)
      goto LAB_0012a1d0;
    } while ((_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
              )puVar1[uVar5]._M_t.
               super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
               ._M_t !=
             (_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
              )0x0);
    this->suffix_head_ = uVar3;
    uVar4 = uVar3;
LAB_0012a1d0:
    if (uVar4 == uVar6) {
      this->suffix_head_ = 0xffffffff;
    }
  }
  return uVar6;
}

Assistant:

uint32_t new_suffix_id_() {
    if (suffix_head_ == NOT_FOUND) {
      auto suffix_id = static_cast<uint32_t>(suffix_subtries_.size());
      suffix_subtries_.push_back(make_unique<SuffixTrieType>());
      return suffix_id;
    }

    auto suffix_id = suffix_head_;
    suffix_subtries_[suffix_id] = make_unique<SuffixTrieType>();

    for (auto i = suffix_head_ + 1; i < suffix_subtries_.size(); ++i) {
      if (!suffix_subtries_[i]) {
        suffix_head_ = i;
        break;
      }
    }
    if (suffix_head_ == suffix_id) {
      suffix_head_ = NOT_FOUND;
    }
    return suffix_id;
  }